

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreState.h
# Opt level: O2

bool __thiscall
axl::sl::BoyerMooreTextState::create
          (BoyerMooreTextState *this,StringRef *pattern,uint64_t charOffset,uint64_t binOffset)

{
  bool bVar1;
  
  enc::
  Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>::
  calcRequiredLength(pattern->m_p,pattern->m_p + pattern->m_length,0xfffd);
  bVar1 = create(this,pattern->m_length,charOffset,binOffset);
  return bVar1;
}

Assistant:

bool
	create(
		const sl::StringRef& pattern,
		uint64_t charOffset,
		uint64_t binOffset
	) {
		size_t patternLength = enc::Convert<enc::Utf32, enc::Utf8>::calcRequiredLength(pattern.cp(), pattern.getEnd());
		return create(pattern.getLength(), charOffset, binOffset);
	}